

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialTxInPeginWitnessCount
              (void *handle,char *tx_hex_string,uint32_t txin_index,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  uint32_t *in_RCX;
  uint32_t in_EDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ConfidentialTxInReference ref;
  ConfidentialTransactionContext tx;
  string *in_stack_fffffffffffffcf8;
  ConfidentialTxInReference *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  CfdError error_code;
  allocator *paVar3;
  ConfidentialTxInReference local_2b8;
  allocator local_151;
  string local_150 [32];
  ConfidentialTransaction local_130 [2];
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  uint32_t *local_28;
  uint32_t local_1c;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    paVar3 = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,local_18,paVar3);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8
              );
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    cfd::core::ConfidentialTransaction::GetTxIn(&local_2b8,local_130,local_1c);
    if (local_28 != (uint32_t *)0x0) {
      uVar2 = cfd::core::ConfidentialTxInReference::GetPeginWitnessStackNum
                        ((ConfidentialTxInReference *)0x5a9db0);
      *local_28 = uVar2;
    }
    local_4 = 0;
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffd00);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_fffffffffffffd00);
    return local_4;
  }
  local_50.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_50.filename = local_50.filename + 1;
  local_50.line = 0x32e;
  local_50.funcname = "CfdGetConfidentialTxInPeginWitnessCount";
  cfd::core::logger::warn<>(&local_50,"tx is null or empty.");
  local_72 = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Failed to parameter. tx is null or empty.",&local_71);
  cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffd10);
  local_72 = 0;
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInPeginWitnessCount(
    void* handle, const char* tx_hex_string, uint32_t txin_index,
    uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    const ConfidentialTxInReference ref = tx.GetTxIn(txin_index);
    if (count != nullptr) {
      *count = ref.GetPeginWitnessStackNum();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}